

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Field.h
# Opt level: O0

void __thiscall FIX::FieldBase::FieldBase(FieldBase *this,FieldBase *rhs)

{
  undefined4 uVar1;
  int iVar2;
  FieldBase *rhs_local;
  FieldBase *this_local;
  
  this->_vptr_FieldBase = (_func_int **)&PTR__FieldBase_001b1250;
  iVar2 = getTag(rhs);
  this->m_tag = iVar2;
  std::__cxx11::string::string((string *)&this->m_string,(string *)&rhs->m_string);
  std::__cxx11::string::string((string *)&this->m_data);
  (this->m_metrics).m_length = (rhs->m_metrics).m_length;
  uVar1 = *(undefined4 *)&(rhs->m_metrics).field_0xc;
  (this->m_metrics).m_checksum = (rhs->m_metrics).m_checksum;
  *(undefined4 *)&(this->m_metrics).field_0xc = uVar1;
  return;
}

Assistant:

FieldBase( const FieldBase& rhs )
  : m_tag( rhs.getTag() )
  , m_string( rhs.m_string )
  , m_metrics( rhs.m_metrics )
  {

  }